

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O0

void __thiscall adios2::format::BP4Deserializer::BP4Deserializer(BP4Deserializer *this,Comm *comm)

{
  Comm *in_RSI;
  void **in_RDI;
  BP4Base *unaff_retaddr;
  Comm *in_stack_00000048;
  BPBase *in_stack_00000050;
  Minifooter *in_stack_ffffffffffffffe0;
  void **vtt;
  
  vtt = in_RDI;
  BPBase::BPBase(in_stack_00000050,in_stack_00000048);
  BP4Base::BP4Base(unaff_retaddr,vtt,in_RSI);
  *in_RDI = vtable + 0x20;
  in_RDI[0x11] = vtable + 0x58;
  in_RDI[0x25] = vtable + 0x90;
  BPBase::Minifooter::Minifooter(in_stack_ffffffffffffffe0,(int8_t)((ulong)in_RDI >> 0x38));
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0x51) = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
         *)0xc6086f);
  return;
}

Assistant:

BP4Deserializer::BP4Deserializer(helper::Comm const &comm)
: BPBase(comm), BP4Base(comm), m_Minifooter(4)
{
}